

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# miniz.c
# Opt level: O0

tdefl_status
tdefl_compress(tdefl_compressor *d,void *pIn_buf,size_t *pIn_buf_size,void *pOut_buf,
              size_t *pOut_buf_size,tdefl_flush flush)

{
  mz_bool mVar1;
  int iVar2;
  mz_ulong mVar3;
  bool local_49;
  size_t local_48;
  tdefl_flush flush_local;
  size_t *pOut_buf_size_local;
  void *pOut_buf_local;
  size_t *pIn_buf_size_local;
  void *pIn_buf_local;
  tdefl_compressor *d_local;
  
  if (d == (tdefl_compressor *)0x0) {
    if (pIn_buf_size != (size_t *)0x0) {
      *pIn_buf_size = 0;
    }
    if (pOut_buf_size != (size_t *)0x0) {
      *pOut_buf_size = 0;
    }
    d_local._4_4_ = TDEFL_STATUS_BAD_PARAM;
  }
  else {
    d->m_pIn_buf = pIn_buf;
    d->m_pIn_buf_size = pIn_buf_size;
    d->m_pOut_buf = pOut_buf;
    d->m_pOut_buf_size = pOut_buf_size;
    d->m_pSrc = (mz_uint8 *)pIn_buf;
    if (pIn_buf_size == (size_t *)0x0) {
      local_48 = 0;
    }
    else {
      local_48 = *pIn_buf_size;
    }
    d->m_src_buf_left = local_48;
    d->m_out_buf_ofs = 0;
    d->m_flush = flush;
    local_49 = pOut_buf != (void *)0x0 || pOut_buf_size != (size_t *)0x0;
    if ((((((d->m_pPut_buf_func != (tdefl_put_buf_func_ptr)0x0) == local_49) ||
          (d->m_prev_return_status != TDEFL_STATUS_OKAY)) ||
         ((d->m_wants_to_finish != 0 && (flush != TDEFL_FINISH)))) ||
        (((pIn_buf_size != (size_t *)0x0 && (*pIn_buf_size != 0)) && (pIn_buf == (void *)0x0)))) ||
       (((pOut_buf_size != (size_t *)0x0 && (*pOut_buf_size != 0)) && (pOut_buf == (void *)0x0)))) {
      if (pIn_buf_size != (size_t *)0x0) {
        *pIn_buf_size = 0;
      }
      if (pOut_buf_size != (size_t *)0x0) {
        *pOut_buf_size = 0;
      }
      d->m_prev_return_status = TDEFL_STATUS_BAD_PARAM;
      d_local._4_4_ = TDEFL_STATUS_BAD_PARAM;
    }
    else {
      d->m_wants_to_finish = (uint)(flush == TDEFL_FINISH) | d->m_wants_to_finish;
      if ((d->m_output_flush_remaining == 0) && (d->m_finished == 0)) {
        if ((((d->m_flags & 0xfff) == 1) && ((d->m_flags & 0x4000) != 0)) &&
           ((d->m_flags & 0xb0000) == 0)) {
          mVar1 = tdefl_compress_fast(d);
          if (mVar1 == 0) {
            return d->m_prev_return_status;
          }
        }
        else {
          mVar1 = tdefl_compress_normal(d);
          if (mVar1 == 0) {
            return d->m_prev_return_status;
          }
        }
        if (((d->m_flags & 0x3000) != 0) && (pIn_buf != (void *)0x0)) {
          mVar3 = mz_adler32((ulong)d->m_adler32,(uchar *)pIn_buf,(long)d->m_pSrc - (long)pIn_buf);
          d->m_adler32 = (mz_uint)mVar3;
        }
        if (((flush != TDEFL_NO_FLUSH) && (d->m_lookahead_size == 0)) &&
           ((d->m_src_buf_left == 0 && (d->m_output_flush_remaining == 0)))) {
          iVar2 = tdefl_flush_block(d,flush);
          if (iVar2 < 0) {
            return d->m_prev_return_status;
          }
          d->m_finished = (uint)(flush == TDEFL_FINISH);
          if (flush == TDEFL_FULL_FLUSH) {
            memset(d->m_hash,0,0x10000);
            memset(d->m_next,0,0x10000);
            d->m_dict_size = 0;
          }
        }
        d_local._4_4_ = tdefl_flush_output_buffer(d);
        d->m_prev_return_status = d_local._4_4_;
      }
      else {
        d_local._4_4_ = tdefl_flush_output_buffer(d);
        d->m_prev_return_status = d_local._4_4_;
      }
    }
  }
  return d_local._4_4_;
}

Assistant:

tdefl_status tdefl_compress(tdefl_compressor *d, const void *pIn_buf, size_t *pIn_buf_size, void *pOut_buf, size_t *pOut_buf_size, tdefl_flush flush)
{
    if (!d)
    {
        if (pIn_buf_size)
            *pIn_buf_size = 0;
        if (pOut_buf_size)
            *pOut_buf_size = 0;
        return TDEFL_STATUS_BAD_PARAM;
    }

    d->m_pIn_buf = pIn_buf;
    d->m_pIn_buf_size = pIn_buf_size;
    d->m_pOut_buf = pOut_buf;
    d->m_pOut_buf_size = pOut_buf_size;
    d->m_pSrc = (const mz_uint8 *)(pIn_buf);
    d->m_src_buf_left = pIn_buf_size ? *pIn_buf_size : 0;
    d->m_out_buf_ofs = 0;
    d->m_flush = flush;

    if (((d->m_pPut_buf_func != NULL) == ((pOut_buf != NULL) || (pOut_buf_size != NULL))) || (d->m_prev_return_status != TDEFL_STATUS_OKAY) ||
        (d->m_wants_to_finish && (flush != TDEFL_FINISH)) || (pIn_buf_size && *pIn_buf_size && !pIn_buf) || (pOut_buf_size && *pOut_buf_size && !pOut_buf))
    {
        if (pIn_buf_size)
            *pIn_buf_size = 0;
        if (pOut_buf_size)
            *pOut_buf_size = 0;
        return (d->m_prev_return_status = TDEFL_STATUS_BAD_PARAM);
    }
    d->m_wants_to_finish |= (flush == TDEFL_FINISH);

    if ((d->m_output_flush_remaining) || (d->m_finished))
        return (d->m_prev_return_status = tdefl_flush_output_buffer(d));

#if MINIZ_USE_UNALIGNED_LOADS_AND_STORES && MINIZ_LITTLE_ENDIAN
    if (((d->m_flags & TDEFL_MAX_PROBES_MASK) == 1) &&
        ((d->m_flags & TDEFL_GREEDY_PARSING_FLAG) != 0) &&
        ((d->m_flags & (TDEFL_FILTER_MATCHES | TDEFL_FORCE_ALL_RAW_BLOCKS | TDEFL_RLE_MATCHES)) == 0))
    {
        if (!tdefl_compress_fast(d))
            return d->m_prev_return_status;
    }
    else
#endif /* #if MINIZ_USE_UNALIGNED_LOADS_AND_STORES && MINIZ_LITTLE_ENDIAN */
    {
        if (!tdefl_compress_normal(d))
            return d->m_prev_return_status;
    }

    if ((d->m_flags & (TDEFL_WRITE_ZLIB_HEADER | TDEFL_COMPUTE_ADLER32)) && (pIn_buf))
        d->m_adler32 = (mz_uint32)mz_adler32(d->m_adler32, (const mz_uint8 *)pIn_buf, d->m_pSrc - (const mz_uint8 *)pIn_buf);

    if ((flush) && (!d->m_lookahead_size) && (!d->m_src_buf_left) && (!d->m_output_flush_remaining))
    {
        if (tdefl_flush_block(d, flush) < 0)
            return d->m_prev_return_status;
        d->m_finished = (flush == TDEFL_FINISH);
        if (flush == TDEFL_FULL_FLUSH)
        {
            MZ_CLEAR_OBJ(d->m_hash);
            MZ_CLEAR_OBJ(d->m_next);
            d->m_dict_size = 0;
        }
    }

    return (d->m_prev_return_status = tdefl_flush_output_buffer(d));
}